

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O0

Color * __thiscall Sphere::getTextureColor(Color *__return_storage_ptr__,Sphere *this,Vector3 *p)

{
  bool bVar1;
  double *pdVar2;
  double dVar3;
  Vector3 local_98;
  double local_80;
  double u;
  double v;
  double local_68;
  double local_60;
  double local_58;
  double a;
  double b;
  undefined1 local_30 [8];
  Vector3 n;
  Vector3 *p_local;
  Sphere *this_local;
  
  n.z = (double)p;
  bVar1 = Material::hasTexture((this->super_Object).m_material);
  if (bVar1) {
    operator-((Vector3 *)&b,(Vector3 *)n.z,&this->m_o);
    Vector3::unitize((Vector3 *)local_30,(Vector3 *)&b);
    dVar3 = Vector3::dot((Vector3 *)local_30,&this->m_dz);
    a = acos(dVar3);
    dVar3 = Vector3::dot((Vector3 *)local_30,&this->m_dx);
    local_60 = sin(a);
    local_60 = dVar3 / local_60;
    local_68 = -1.0;
    pdVar2 = std::max<double>(&local_60,&local_68);
    v = 1.0;
    pdVar2 = std::min<double>(pdVar2,&v);
    local_58 = acos(*pdVar2);
    u = a / Const::PI;
    local_80 = (local_58 / 2.0) / Const::PI;
    operator*(&local_98,&this->m_dz,&this->m_dx);
    dVar3 = Vector3::dot((Vector3 *)local_30,&local_98);
    if (dVar3 < 0.0) {
      local_80 = 1.0 - local_80;
    }
    Material::getTextureColor(__return_storage_ptr__,(this->super_Object).m_material,local_80,u);
  }
  else {
    Color::Color(__return_storage_ptr__,1.0,1.0,1.0);
  }
  return __return_storage_ptr__;
}

Assistant:

Color Sphere::getTextureColor(const Vector3& p) const
{
    if (m_material->hasTexture())
    {
        Vector3 n = (p - m_o).unitize();
        double b = acos(n.dot(m_dz)), a = acos(std::min(std::max(n.dot(m_dx) / sin(b), -1.0), 1.0));
        double v = b / Const::PI, u = a / 2 / Const::PI;
        if (n.dot(m_dz * m_dx) < 0) u = 1 - u;
        return m_material->getTextureColor(u, v);
    }
    else
        return Color(1, 1, 1);
}